

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall
Catch::JunitReporter::testGroupEnded(JunitReporter *this,TestGroupStats *testGroupStats)

{
  __shared_ptr_access<Catch::CumulativeReporterBase::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *this_00;
  element_type *groupNode;
  double suiteTime_00;
  double suiteTime;
  TestGroupStats *testGroupStats_local;
  JunitReporter *this_local;
  
  suiteTime_00 = Timer::getElapsedSeconds(&this->suiteTimer);
  CumulativeReporterBase::testGroupEnded(&this->super_CumulativeReporterBase,testGroupStats);
  this_00 = (__shared_ptr_access<Catch::CumulativeReporterBase::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             *)std::
               vector<std::shared_ptr<Catch::CumulativeReporterBase::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>_>
               ::back(&(this->super_CumulativeReporterBase).m_testGroups);
  groupNode = std::
              __shared_ptr_access<Catch::CumulativeReporterBase::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator*(this_00);
  writeGroup(this,groupNode,suiteTime_00);
  return;
}

Assistant:

void JunitReporter::testGroupEnded(TestGroupStats const &testGroupStats) {
        double suiteTime = suiteTimer.getElapsedSeconds();
        CumulativeReporterBase::testGroupEnded(testGroupStats);
        writeGroup(*m_testGroups.back(), suiteTime);
    }